

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void print_symbols(set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_> *v)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  fstream f;
  string local_260;
  char local_240 [16];
  ostream local_230 [512];
  
  std::fstream::fstream(local_240);
  std::fstream::open(local_240,0x10d02a);
  p_Var2 = (v->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(v->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      Symbol::to_string_abi_cxx11_(&local_260,(Symbol *)(p_Var2 + 1));
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_230,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  std::fstream::close();
  std::fstream::~fstream(local_240);
  return;
}

Assistant:

void print_symbols(const set<Symbol> &v) {
    fstream f;
    f.open("symbol.txt", ios::out);
    for (const auto &it : v) {
        f << it.to_string() << endl;
    }
    f.close();
}